

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

XML_Convert_Result utf8_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char *from;
  char *__dest;
  XML_Convert_Result XVar1;
  long lVar2;
  size_t __n;
  bool bVar3;
  char *local_50;
  char *local_48;
  char **local_40;
  char **local_38;
  
  from = *fromP;
  __dest = *toP;
  lVar2 = (long)toLim - (long)__dest;
  local_50 = fromLim;
  if (lVar2 < (long)fromLim - (long)from) {
    local_50 = from + lVar2;
  }
  local_48 = local_50;
  local_40 = fromP;
  local_38 = toP;
  _INTERNAL_trim_to_complete_utf8_characters(from,&local_50);
  bVar3 = local_50 < local_48;
  __n = (long)local_50 - (long)from;
  memcpy(__dest,from,__n);
  *local_40 = *local_40 + __n;
  *local_38 = *local_38 + __n;
  XVar1 = XML_CONVERT_OUTPUT_EXHAUSTED;
  if ((long)fromLim - (long)from <= lVar2) {
    XVar1 = (uint)bVar3;
  }
  return XVar1;
}

Assistant:

static enum XML_Convert_Result PTRCALL
utf8_toUtf8(const ENCODING *enc, const char **fromP, const char *fromLim,
            char **toP, const char *toLim) {
  bool input_incomplete = false;
  bool output_exhausted = false;

  /* Avoid copying partial characters (due to limited space). */
  const ptrdiff_t bytesAvailable = fromLim - *fromP;
  const ptrdiff_t bytesStorable = toLim - *toP;
  UNUSED_P(enc);
  if (bytesAvailable > bytesStorable) {
    fromLim = *fromP + bytesStorable;
    output_exhausted = true;
  }

  /* Avoid copying partial characters (from incomplete input). */
  {
    const char *const fromLimBefore = fromLim;
    _INTERNAL_trim_to_complete_utf8_characters(*fromP, &fromLim);
    if (fromLim < fromLimBefore) {
      input_incomplete = true;
    }
  }

  {
    const ptrdiff_t bytesToCopy = fromLim - *fromP;
    memcpy(*toP, *fromP, bytesToCopy);
    *fromP += bytesToCopy;
    *toP += bytesToCopy;
  }

  if (output_exhausted) /* needs to go first */
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else if (input_incomplete)
    return XML_CONVERT_INPUT_INCOMPLETE;
  else
    return XML_CONVERT_COMPLETED;
}